

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

pair<unsigned_long,_bool> __thiscall CConnman::SocketSendData(CConnman *this,CNode *node)

{
  rep rVar1;
  pointer puVar2;
  pointer puVar3;
  _Head_base<0UL,_Transport_*,_false> _Var4;
  element_type *peVar5;
  size_t sVar6;
  iterator __first;
  iterator __last;
  _Elt_pointer __k;
  _Map_pointer ppCVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  time_point tVar12;
  mapped_type_conflict5 *pmVar13;
  undefined4 extraout_var;
  int *piVar14;
  Logger *this_00;
  unsigned_long uVar15;
  ulong unaff_RBP;
  ulong uVar16;
  _Elt_pointer pCVar17;
  long in_FS_OFFSET;
  string_view source_file;
  pair<unsigned_long,_bool> pVar18;
  string_view logging_function;
  undefined8 in_stack_ffffffffffffff38;
  _Map_pointer ppCVar19;
  _Elt_pointer pCVar20;
  mapMsgTypeSize *this_01;
  Mutex *pMVar21;
  _Elt_pointer in_stack_ffffffffffffff68;
  _Elt_pointer in_stack_ffffffffffffff70;
  _Elt_pointer local_78;
  CSerializedNetMsg *local_70;
  CSerializedNetMsg *local_68;
  _Map_pointer local_60;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock56;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar17 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pCVar20 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppCVar19 = (node->vSendMsg).
             super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pMVar21 = &node->m_sock_mutex;
  this_01 = &node->mapSendBytesPerMsgType;
  uVar15 = 0;
  while( true ) {
    if (pCVar17 !=
        (node->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      puVar2 = (pCVar17->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pCVar17->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var4._M_head_impl =
           (node->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      iVar9 = (*(_Var4._M_head_impl)->_vptr_Transport[6])(_Var4._M_head_impl,pCVar17);
      if ((char)iVar9 != '\0') {
        lVar11 = ((ulong)(puVar3 + (0x1f - (long)puVar2)) & 0xfffffffffffffff0) + 0x38;
        if (puVar3 == puVar2) {
          lVar11 = 0x38;
        }
        node->m_send_memusage = node->m_send_memusage - lVar11;
        pCVar17 = pCVar17 + 1;
        if (pCVar17 == pCVar20) {
          pCVar17 = ppCVar19[1];
          ppCVar19 = ppCVar19 + 1;
          pCVar20 = pCVar17 + 9;
        }
      }
    }
    _Var4._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    (*(_Var4._M_head_impl)->_vptr_Transport[7])
              (&local_78,_Var4._M_head_impl,
               (ulong)(pCVar17 !=
                      (node->vSendMsg).
                      super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_cur));
    ppCVar7 = local_60;
    __k = local_78;
    if (local_60 == (_Map_pointer)0x0) break;
    criticalblock56.super_unique_lock._8_8_ =
         criticalblock56.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock56.super_unique_lock._M_device = &pMVar21->super_mutex;
    std::unique_lock<std::mutex>::lock(&criticalblock56.super_unique_lock);
    peVar5 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock56.super_unique_lock);
      uVar16 = CONCAT71((int7)(unaff_RBP >> 8),1);
      goto LAB_008c1ff1;
    }
    uVar10 = (*peVar5->_vptr_Sock[3])
                       (peVar5,local_68,local_60,(ulong)((uint)(byte)local_70 << 0xf | 0x4040));
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock56.super_unique_lock);
    if ((int)uVar10 < 1) {
      uVar16 = CONCAT71((uint7)(uint3)(uVar10 >> 8),1);
      if (-1 < (int)uVar10) goto LAB_008c1ff1;
      piVar14 = __errno_location();
      iVar9 = *piVar14;
      if (iVar9 < 0x5a) {
        if ((iVar9 == 4) || (iVar9 == 0xb)) goto LAB_008c1ff1;
      }
      else if ((iVar9 == 0x5a) || (iVar9 == 0x73)) goto LAB_008c1ff1;
      this_00 = LogInstance();
      bVar8 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      if (bVar8) {
        in_stack_ffffffffffffff68 = (_Elt_pointer)node->id;
        NetworkErrorString_abi_cxx11_((string *)&criticalblock56,iVar9);
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        logging_function._M_str = "SocketSendData";
        logging_function._M_len = 0xe;
        LogPrintf_<long,std::__cxx11::string>
                  (logging_function,source_file,0x661,NET,Debug,
                   "socket send error for peer=%d: %s\n",(long *)&stack0xffffffffffffff68,
                   (string *)&criticalblock56);
        if (criticalblock56.super_unique_lock._M_device != (mutex_type *)&stack0xffffffffffffffb8) {
          operator_delete(criticalblock56.super_unique_lock._M_device,local_48 + 1);
        }
      }
      CNode::CloseSocketDisconnect(node);
      goto LAB_008c1ff1;
    }
    tVar12 = NodeClock::now();
    LOCK();
    rVar1 = (node->m_last_send)._M_i.__r;
    (node->m_last_send)._M_i.__r = (long)tVar12.__d.__r / 1000000000;
    UNLOCK();
    unaff_RBP = (ulong)(uVar10 & 0x7fffffff);
    node->nSendBytes = node->nSendBytes + unaff_RBP;
    _Var4._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    (*(_Var4._M_head_impl)->_vptr_Transport[8])(_Var4._M_head_impl,unaff_RBP,rVar1);
    if ((__k->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[](this_01,(key_type *)__k);
      *pmVar13 = *pmVar13 + unaff_RBP;
    }
    uVar15 = uVar15 + unaff_RBP;
    if (local_60 != (_Map_pointer)unaff_RBP) break;
  }
  uVar16 = CONCAT71((int7)(unaff_RBP >> 8),ppCVar7 != (_Map_pointer)0x0);
LAB_008c1ff1:
  sVar6 = node->m_send_memusage;
  iVar9 = (*((node->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
  LOCK();
  (node->fPauseSend)._M_base._M_i =
       (ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar9) + sVar6;
  UNLOCK();
  if ((pCVar17 ==
       (node->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur) && (node->m_send_memusage != 0)) {
    __assert_fail("node.m_send_memusage == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0x66c,"std::pair<size_t, bool> CConnman::SocketSendData(CNode &) const");
  }
  local_78 = (node->vSendMsg).
             super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  local_60 = (node->vSendMsg).
             super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  local_70 = *local_60;
  local_68 = local_70 + 9;
  criticalblock56.super_unique_lock._8_8_ = *ppCVar19;
  local_48 = criticalblock56.super_unique_lock._8_8_ + 0x1f8;
  __first._M_first = (_Elt_pointer)ppCVar19;
  __first._M_cur = (_Elt_pointer)in_stack_ffffffffffffff38;
  __first._M_last = pCVar20;
  __first._M_node = (_Map_pointer)this;
  __last._M_first = (_Elt_pointer)pMVar21;
  __last._M_cur = (_Elt_pointer)this_01;
  __last._M_last = in_stack_ffffffffffffff68;
  __last._M_node = (_Map_pointer)in_stack_ffffffffffffff70;
  criticalblock56.super_unique_lock._M_device = (mutex_type *)pCVar17;
  local_40 = ppCVar19;
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::_M_erase
            ((iterator *)&stack0xffffffffffffff68,&node->vSendMsg,__first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  pVar18._8_8_ = uVar16 & 0xffffffff;
  pVar18.first = uVar15;
  return pVar18;
}

Assistant:

std::pair<size_t, bool> CConnman::SocketSendData(CNode& node) const
{
    auto it = node.vSendMsg.begin();
    size_t nSentSize = 0;
    bool data_left{false}; //!< second return value (whether unsent data remains)
    std::optional<bool> expected_more;

    while (true) {
        if (it != node.vSendMsg.end()) {
            // If possible, move one message from the send queue to the transport. This fails when
            // there is an existing message still being sent, or (for v2 transports) when the
            // handshake has not yet completed.
            size_t memusage = it->GetMemoryUsage();
            if (node.m_transport->SetMessageToSend(*it)) {
                // Update memory usage of send buffer (as *it will be deleted).
                node.m_send_memusage -= memusage;
                ++it;
            }
        }
        const auto& [data, more, msg_type] = node.m_transport->GetBytesToSend(it != node.vSendMsg.end());
        // We rely on the 'more' value returned by GetBytesToSend to correctly predict whether more
        // bytes are still to be sent, to correctly set the MSG_MORE flag. As a sanity check,
        // verify that the previously returned 'more' was correct.
        if (expected_more.has_value()) Assume(!data.empty() == *expected_more);
        expected_more = more;
        data_left = !data.empty(); // will be overwritten on next loop if all of data gets sent
        int nBytes = 0;
        if (!data.empty()) {
            LOCK(node.m_sock_mutex);
            // There is no socket in case we've already disconnected, or in test cases without
            // real connections. In these cases, we bail out immediately and just leave things
            // in the send queue and transport.
            if (!node.m_sock) {
                break;
            }
            int flags = MSG_NOSIGNAL | MSG_DONTWAIT;
#ifdef MSG_MORE
            if (more) {
                flags |= MSG_MORE;
            }
#endif
            nBytes = node.m_sock->Send(reinterpret_cast<const char*>(data.data()), data.size(), flags);
        }
        if (nBytes > 0) {
            node.m_last_send = GetTime<std::chrono::seconds>();
            node.nSendBytes += nBytes;
            // Notify transport that bytes have been processed.
            node.m_transport->MarkBytesSent(nBytes);
            // Update statistics per message type.
            if (!msg_type.empty()) { // don't report v2 handshake bytes for now
                node.AccountForSentBytes(msg_type, nBytes);
            }
            nSentSize += nBytes;
            if ((size_t)nBytes != data.size()) {
                // could not send full message; stop sending more
                break;
            }
        } else {
            if (nBytes < 0) {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS) {
                    LogDebug(BCLog::NET, "socket send error for peer=%d: %s\n", node.GetId(), NetworkErrorString(nErr));
                    node.CloseSocketDisconnect();
                }
            }
            break;
        }
    }

    node.fPauseSend = node.m_send_memusage + node.m_transport->GetSendMemoryUsage() > nSendBufferMaxSize;

    if (it == node.vSendMsg.end()) {
        assert(node.m_send_memusage == 0);
    }
    node.vSendMsg.erase(node.vSendMsg.begin(), it);
    return {nSentSize, data_left};
}